

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureType::~IfcFurnitureType(IfcFurnitureType *this,void **vtt)

{
  void **vtt_local;
  IfcFurnitureType *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x88 = vtt[0x2b];
  *(void **)&this->field_0x98 = vtt[0x2c];
  *(void **)&this->field_0xf0 = vtt[0x2d];
  *(void **)&this->field_0x148 = vtt[0x2e];
  *(void **)&this->field_0x180 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x30];
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10)
  ;
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>,vtt + 0x28);
  IfcFurnishingElementType::~IfcFurnishingElementType((IfcFurnishingElementType *)this,vtt + 1);
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}